

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionEntryPointInfo::Expire(FunctionEntryPointInfo *this)

{
  code *pcVar1;
  anon_class_24_3_4fbf12b2 fn;
  anon_class_16_2_2511f9eb func;
  FunctionEntryPointInfo *entryPointInfo;
  FunctionEntryPointInfo *pFVar2;
  bool bVar3;
  ExecutionMode EVar4;
  uint sourceContextId;
  LocalFunctionId functionId;
  FunctionProxy *pFVar5;
  ScriptContext *pSVar6;
  ThreadContext *this_00;
  undefined4 *puVar7;
  FunctionBody *this_01;
  JavascriptMethod p_Var8;
  ScriptConfiguration *this_02;
  NativeCodeGenerator *nativeCodeGen;
  void *pvVar9;
  JavascriptMethod local_140;
  JavascriptMethod local_138;
  OutOfMemoryException anon_var_0;
  JavascriptMethod local_80;
  JavascriptMethod simpleJitNativeAddress;
  JavascriptMethod newDirectEntryPoint;
  JavascriptMethod currentThunk;
  JavascriptMethod newOriginalEntryPoint;
  FunctionEntryPointInfo **local_58;
  FunctionEntryPointInfo *local_50;
  FunctionEntryPointInfo *defaultEntryPointInfo;
  FunctionEntryPointInfo *newEntryPoint;
  AutoNestedHandledExceptionType local_30;
  byte local_29;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  bool expiringSimpleJitEntryPointInfo;
  FunctionEntryPointInfo *simpleJitEntryPointInfo;
  FunctionBody *functionBody;
  ThreadContext *threadContext;
  FunctionEntryPointInfo *this_local;
  
  if (((this->lastCallsCount == this->callsCount) &&
      (bVar3 = EntryPointInfo::IsNativeEntryPointProcessed(&this->super_EntryPointInfo), bVar3)) &&
     (bVar3 = EntryPointInfo::IsCleanedUp(&this->super_EntryPointInfo), !bVar3)) {
    pFVar5 = Memory::WriteBarrierPtr<Js::FunctionProxy>::operator->(&this->functionProxy);
    pSVar6 = FunctionProxy::GetScriptContext(pFVar5);
    this_00 = ScriptContext::GetThreadContext(pSVar6);
    pFVar5 = Memory::WriteBarrierPtr<Js::FunctionProxy>::operator->(&this->functionProxy);
    bVar3 = FunctionProxy::IsDeferred(pFVar5);
    if (bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x2475,"(!this->functionProxy->IsDeferred())",
                                  "!this->functionProxy->IsDeferred()");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    pFVar5 = Memory::WriteBarrierPtr<Js::FunctionProxy>::operator->(&this->functionProxy);
    this_01 = FunctionProxy::GetFunctionBody(pFVar5);
    ___autoNestedHandledExceptionType = FunctionBody::GetSimpleJitEntryPointInfo(this_01);
    local_29 = ___autoNestedHandledExceptionType == this;
    if ((bool)local_29) {
      EVar4 = FunctionBody::GetExecutionMode(this_01);
      if (EVar4 != FullJit) {
        return;
      }
      ___autoNestedHandledExceptionType = (FunctionEntryPointInfo *)0x0;
      FunctionBody::SetSimpleJitEntryPointInfo(this_01,(FunctionEntryPointInfo *)0x0);
    }
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (&local_30,ExceptionType_OutOfMemory);
    defaultEntryPointInfo = (FunctionEntryPointInfo *)0x0;
    local_50 = FunctionBody::GetDefaultFunctionEntryPointInfo(this_01);
    entryPointInfo = ___autoNestedHandledExceptionType;
    pFVar2 = local_50;
    if (this == local_50) {
      if (___autoNestedHandledExceptionType == (FunctionEntryPointInfo *)0x0) {
        bVar3 = FunctionBody::GetIsAsmJsFunction(this_01);
        if (bVar3) {
          defaultEntryPointInfo = FunctionBody::CreateNewDefaultEntryPoint(this_01);
          EntryPointInfo::SetIsAsmJSFunction(&defaultEntryPointInfo->super_EntryPointInfo,true);
          (defaultEntryPointInfo->super_EntryPointInfo).super_ProxyEntryPointInfo.jsMethod =
               InterpreterStackFrame::AsmJsDelayDynamicInterpreterThunk;
          FunctionBody::SetIsAsmJsFullJitScheduled(this_01,false);
          FunctionBody::SetDefaultInterpreterExecutionMode(this_01);
          pFVar5 = Memory::WriteBarrierPtr<Js::FunctionProxy>::operator->(&this->functionProxy);
          FunctionProxy::SetOriginalEntryPoint
                    (pFVar5,InterpreterStackFrame::AsmJsDelayDynamicInterpreterThunk);
        }
        else {
          defaultEntryPointInfo = FunctionBody::CreateNewDefaultEntryPoint(this_01);
          FunctionBody::ReinitializeExecutionModeAndLimits(this_01);
          sourceContextId = FunctionProxy::GetSourceContextId((FunctionProxy *)this_01);
          functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this_01);
          bVar3 = Phases::IsEnabled((Phases *)&DAT_01eafdf0,BackEndPhase,sourceContextId,functionId)
          ;
          if (!bVar3) {
            pSVar6 = FunctionProxy::GetScriptContext((FunctionProxy *)this_01);
            this_02 = ScriptContext::GetConfig(pSVar6);
            bVar3 = ScriptConfiguration::IsNoNative(this_02);
            if (!bVar3) {
              pSVar6 = FunctionProxy::GetScriptContext((FunctionProxy *)this_01);
              nativeCodeGen = ScriptContext::GetNativeCodeGenerator(pSVar6);
              GenerateFunction(nativeCodeGen,this_01,(ScriptFunction *)0x0);
            }
          }
        }
      }
      else {
        defaultEntryPointInfo = ___autoNestedHandledExceptionType;
        p_Var8 = EntryPointInfo::GetNativeEntrypoint
                           (&___autoNestedHandledExceptionType->super_EntryPointInfo);
        FunctionBody::SetDefaultFunctionEntryPointInfo(this_01,entryPointInfo,p_Var8);
        FunctionBody::ResetSimpleJitLimitAndCallCount(this_01);
      }
      FunctionBody::TraceExecutionMode(this_01,"JitCodeExpired");
      pFVar2 = defaultEntryPointInfo;
    }
    defaultEntryPointInfo = pFVar2;
    Output::Trace(ExpirableCollectPhase,L"Expiring 0x%p\n",this);
    pFVar5 = Memory::WriteBarrierPtr<Js::FunctionProxy>::operator->(&this->functionProxy);
    local_58 = &defaultEntryPointInfo;
    func.newEntryPoint = local_58;
    func.this = this;
    newOriginalEntryPoint = (JavascriptMethod)this;
    FunctionProxy::MapFunctionObjectTypes<Js::FunctionEntryPointInfo::Expire()::__0>(pFVar5,func);
    if ((local_29 & 1) != 0) {
      pvVar9 = FunctionBody::GetDynamicInterpreterEntryPoint(this_01);
      if (pvVar9 == (void *)0x0) {
        local_138 = InterpreterStackFrame::DelayDynamicInterpreterThunk;
      }
      else {
        pvVar9 = FunctionBody::GetDynamicInterpreterEntryPoint(this_01);
        local_138 = (JavascriptMethod)InterpreterThunkEmitter::ConvertToEntryPoint(pvVar9);
      }
      currentThunk = local_138;
      pSVar6 = FunctionProxy::GetScriptContext((FunctionProxy *)this_01);
      newDirectEntryPoint = pSVar6->CurrentThunk;
      local_140 = newDirectEntryPoint;
      if (newDirectEntryPoint == InterpreterStackFrame::DelayDynamicInterpreterThunk) {
        local_140 = currentThunk;
      }
      simpleJitNativeAddress = local_140;
      local_80 = EntryPointInfo::GetNativeEntrypoint(&this->super_EntryPointInfo);
      fn.simpleJitNativeAddress = &local_80;
      fn.this = this;
      fn.newDirectEntryPoint = &simpleJitNativeAddress;
      FunctionBody::MapEntryPoints<Js::FunctionEntryPointInfo::Expire()::__1>(this_01,fn);
      p_Var8 = FunctionProxy::GetOriginalEntryPoint_Unchecked((FunctionProxy *)this_01);
      if (p_Var8 == local_80) {
        FunctionProxy::SetOriginalEntryPoint((FunctionProxy *)this_01,currentThunk);
        FunctionProxy::VerifyOriginalEntryPoint((FunctionProxy *)this_01);
      }
    }
    ThreadContext::QueueFreeOldEntryPointInfoIfInScript(this_00,this);
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_30);
  }
  return;
}

Assistant:

void FunctionEntryPointInfo::Expire()
    {
        if (this->lastCallsCount != this->callsCount || !this->IsNativeEntryPointProcessed() || this->IsCleanedUp())
        {
            return;
        }

        ThreadContext* threadContext = this->functionProxy->GetScriptContext()->GetThreadContext();

        Assert(!this->functionProxy->IsDeferred());
        FunctionBody* functionBody = this->functionProxy->GetFunctionBody();

        FunctionEntryPointInfo *simpleJitEntryPointInfo = functionBody->GetSimpleJitEntryPointInfo();
        const bool expiringSimpleJitEntryPointInfo = simpleJitEntryPointInfo == this;
        if(expiringSimpleJitEntryPointInfo)
        {
            if(functionBody->GetExecutionMode() != ExecutionMode::FullJit)
            {
                // Don't expire simple JIT code until the transition to full JIT
                return;
            }
            simpleJitEntryPointInfo = nullptr;
            functionBody->SetSimpleJitEntryPointInfo(nullptr);
        }

        try
        {
            AUTO_NESTED_HANDLED_EXCEPTION_TYPE(ExceptionType_OutOfMemory);

            FunctionEntryPointInfo* newEntryPoint = nullptr;
            FunctionEntryPointInfo *const defaultEntryPointInfo = functionBody->GetDefaultFunctionEntryPointInfo();
            if(this == defaultEntryPointInfo)
            {
                if(simpleJitEntryPointInfo)
                {
                    newEntryPoint = simpleJitEntryPointInfo;
                    functionBody->SetDefaultFunctionEntryPointInfo(simpleJitEntryPointInfo, newEntryPoint->GetNativeEntrypoint());
                    functionBody->ResetSimpleJitLimitAndCallCount();
                }
#ifdef ASMJS_PLAT
                else if (functionBody->GetIsAsmJsFunction())
                {
                    // the new entrypoint will be set to interpreter
                    newEntryPoint = functionBody->CreateNewDefaultEntryPoint();
                    newEntryPoint->SetIsAsmJSFunction(true);
                    newEntryPoint->jsMethod = AsmJsDefaultEntryThunk;
                    functionBody->SetIsAsmJsFullJitScheduled(false);
                    functionBody->SetDefaultInterpreterExecutionMode();
                    this->functionProxy->SetOriginalEntryPoint(AsmJsDefaultEntryThunk);
                }
#endif
                else
                {
                    newEntryPoint = functionBody->CreateNewDefaultEntryPoint();
                    functionBody->ReinitializeExecutionModeAndLimits();
#if ENABLE_NATIVE_CODEGEN
                    // In order for the function to ever get JIT again, we need to call GenerateFunction now
                    if (!PHASE_OFF(Js::BackEndPhase, functionBody) && !functionBody->GetScriptContext()->GetConfig()->IsNoNative())
                    {
                        GenerateFunction(functionBody->GetScriptContext()->GetNativeCodeGenerator(), functionBody);
                    }
#endif
                }
                functionBody->TraceExecutionMode("JitCodeExpired");
            }
            else
            {
                newEntryPoint = defaultEntryPointInfo;
            }

            OUTPUT_TRACE(Js::ExpirableCollectPhase,  _u("Expiring 0x%p\n"), this);
            this->functionProxy->MapFunctionObjectTypes([&] (ScriptFunctionType* functionType)
            {
                Assert(functionType->GetTypeId() == TypeIds_Function);

                if (functionType->GetEntryPointInfo() == this)
                {
                    OUTPUT_TRACE(Js::ExpirableCollectPhase, _u("Type 0x%p uses this entry point- switching to default entry point\n"), this);
                    functionType->SetEntryPointInfo(newEntryPoint);
                    // we are allowed to replace the entry point on the type only if it's
                    // directly using the jitted code or a type is referencing this entry point
                    // but the entry point hasn't been called since the codegen thunk was installed on it
                    if (functionType->GetEntryPoint() == functionProxy->GetDirectEntryPoint(this) || IsIntermediateCodeGenThunk(functionType->GetEntryPoint()))
                    {
                        functionType->SetEntryPoint(this->functionProxy->GetDirectEntryPoint(newEntryPoint));
                    }
                }
                else
                {
                    Assert(!functionType->GetEntryPointInfo()->IsFunctionEntryPointInfo() ||
                        ((FunctionEntryPointInfo*)functionType->GetEntryPointInfo())->IsCleanedUp()
                        || functionType->GetEntryPoint() != this->GetNativeEntrypoint());
                }
            });

            if(expiringSimpleJitEntryPointInfo)
            {
                // We could have just created a new entry point info that is using the simple JIT code. An allocation may have
                // triggered shortly after, resulting in expiring the simple JIT entry point info. Update any entry point infos
                // that are using the simple JIT code, and update the original entry point as necessary as well.
                const JavascriptMethod newOriginalEntryPoint =
                    functionBody->GetDynamicInterpreterEntryPoint()
                        ?   reinterpret_cast<JavascriptMethod>(
                                InterpreterThunkEmitter::ConvertToEntryPoint(functionBody->GetDynamicInterpreterEntryPoint()))
                        :   DefaultEntryThunk;
                const JavascriptMethod currentThunk = functionBody->GetScriptContext()->CurrentThunk;
                const JavascriptMethod newDirectEntryPoint =
                    currentThunk == DefaultEntryThunk ? newOriginalEntryPoint : currentThunk;
                const JavascriptMethod simpleJitNativeAddress = GetNativeEntrypoint();
                functionBody->MapEntryPoints([&](const int entryPointIndex, FunctionEntryPointInfo *const entryPointInfo)
                {
                    if(entryPointInfo != this && entryPointInfo->jsMethod == simpleJitNativeAddress)
                    {
                        entryPointInfo->jsMethod = newDirectEntryPoint;
                    }
                });
                if(functionBody->GetOriginalEntryPoint_Unchecked() == simpleJitNativeAddress)
                {
                    functionBody->SetOriginalEntryPoint(newOriginalEntryPoint);
                    functionBody->VerifyOriginalEntryPoint();
                }
            }

            threadContext->QueueFreeOldEntryPointInfoIfInScript(this);
        }